

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O0

bool __thiscall
QSocks5PasswordAuthenticator::beginAuthenticate
          (QSocks5PasswordAuthenticator *this,QTcpSocket *socket,bool *completed)

{
  qsizetype qVar1;
  qsizetype qVar2;
  char *pcVar3;
  char *pcVar4;
  size_t sVar5;
  long lVar6;
  undefined1 *in_RDX;
  QByteArray *in_RSI;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  int pos;
  char *buf;
  QByteArray dataBuf;
  QByteArray passwd;
  QByteArray uname;
  QString *in_stack_ffffffffffffff08;
  QByteArray local_68;
  QByteArray local_48;
  QByteArray local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RDX = 0;
  local_28.d.size = -0x5555555555555556;
  local_28.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_28.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  QString::toLatin1(in_stack_ffffffffffffff08);
  local_48.d.size = -0x5555555555555556;
  local_48.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_48.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  QString::toLatin1(in_stack_ffffffffffffff08);
  local_68.d.size = -0x5555555555555556;
  local_68.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_68.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  qVar1 = QByteArray::size(&local_28);
  qVar2 = QByteArray::size(&local_48);
  QByteArray::QByteArray(&local_68,qVar1 + 3 + qVar2,'\0');
  pcVar3 = QByteArray::data(in_RDI);
  *pcVar3 = '\x01';
  qVar1 = QByteArray::size(&local_28);
  pcVar3[1] = (char)qVar1;
  pcVar4 = QByteArray::data(in_RDI);
  sVar5 = QByteArray::size(&local_28);
  memcpy(pcVar3 + 2,pcVar4,sVar5);
  qVar1 = QByteArray::size(&local_28);
  qVar2 = QByteArray::size(&local_48);
  pcVar3[(int)qVar1 + 2] = (char)qVar2;
  pcVar4 = QByteArray::data(in_RDI);
  sVar5 = QByteArray::size(&local_48);
  memcpy(pcVar3 + ((int)qVar1 + 3),pcVar4,sVar5);
  lVar6 = QIODevice::write(in_RSI);
  qVar1 = QByteArray::size(&local_68);
  QByteArray::~QByteArray((QByteArray *)0x36f3ac);
  QByteArray::~QByteArray((QByteArray *)0x36f3b6);
  QByteArray::~QByteArray((QByteArray *)0x36f3c0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return lVar6 == qVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QSocks5PasswordAuthenticator::beginAuthenticate(QTcpSocket *socket, bool *completed)
{
    *completed = false;
    QByteArray uname = userName.toLatin1();
    QByteArray passwd = password.toLatin1();
    QByteArray dataBuf(3 + uname.size() + passwd.size(), 0);
    char *buf = dataBuf.data();
    int pos = 0;
    buf[pos++] = S5_PASSWORDAUTH_VERSION;
    buf[pos++] = uname.size();
    memcpy(&buf[pos], uname.data(), uname.size());
    pos += uname.size();
    buf[pos++] = passwd.size();
    memcpy(&buf[pos], passwd.data(), passwd.size());
    return socket->write(dataBuf) == dataBuf.size();
}